

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

optional<slang::TimeScale> __thiscall slang::TimeScale::fromString(TimeScale *this,string_view str)

{
  TimeScaleMagnitude *pTVar1;
  char *pcVar2;
  optional<slang::TimeScaleValue> oVar3;
  optional<slang::TimeScaleValue> oVar4;
  TimeScale *pTVar5;
  TimeScaleMagnitude *pTVar6;
  TimeScaleMagnitude *extraout_RDX;
  TimeScaleMagnitude *pTVar7;
  TimeScaleMagnitude *extraout_RDX_00;
  byte bVar8;
  string_view str_00;
  string_view str_01;
  TimeScale *local_30;
  
  str_00._M_str = (char *)str._M_len;
  str_00._M_len = (size_t)this;
  oVar3 = parseValue(str_00,(size_t *)&local_30);
  pTVar7 = extraout_RDX;
  if (((uint3)oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) {
    pTVar7 = (TimeScaleMagnitude *)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_30 < this);
    if (local_30 < this) {
      if (str_00._M_str[(long)local_30] == ' ') {
        pTVar7 = &this[-1].precision.magnitude;
        pTVar5 = local_30;
        do {
          if ((TimeScale *)pTVar7 == pTVar5) goto LAB_001b015f;
          local_30 = (TimeScale *)&(pTVar5->base).magnitude;
          pcVar2 = str_00._M_str + 1 + (long)pTVar5;
          pTVar5 = local_30;
        } while (*pcVar2 == ' ');
        pTVar7 = (TimeScaleMagnitude *)CONCAT71((int7)((ulong)pTVar7 >> 8),local_30 < this);
      }
      if (((char)pTVar7 != '\0') && (str_00._M_str[(long)local_30] == '/')) {
        do {
          pTVar1 = &(local_30->base).magnitude;
          if (this <= pTVar1) goto LAB_001b015f;
          pcVar2 = str_00._M_str + 1 + (long)local_30;
          local_30 = (TimeScale *)pTVar1;
        } while (*pcVar2 == ' ');
        str_01._M_len = (long)this - (long)pTVar1;
        if (pTVar1 <= this && str_01._M_len != 0) {
          str_01._M_str = str_00._M_str + (long)pTVar1;
          oVar4 = parseValue(str_01,(size_t *)&local_30);
          pTVar6 = (TimeScaleMagnitude *)0x0;
          pTVar7 = extraout_RDX_00;
          if ((((uint3)oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) &&
             ((undefined1 *)((long)this - (long)local_30) == pTVar1)) {
            pTVar6 = (TimeScaleMagnitude *)0x0;
            pTVar7 = (TimeScaleMagnitude *)
                     (ulong)(byte)(-(oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                                     _M_payload.super__Optional_payload_base<slang::TimeScaleValue>.
                                     _M_payload._1_1_ <
                                    oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                                    _M_payload.super__Optional_payload_base<slang::TimeScaleValue>.
                                    _M_payload._1_1_) | 1);
            if (oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_ ==
                oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_) {
              pTVar7 = pTVar6;
            }
            bVar8 = -(oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ <
                     oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_) | 1;
            if (oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ ==
                oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_) {
              bVar8 = (byte)pTVar7;
            }
            if ((char)bVar8 < '\x01') {
              pTVar7 = (TimeScaleMagnitude *)
                       (ulong)((uint3)oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                                      _M_payload.super__Optional_payload_base<slang::TimeScaleValue>
                               & 0xffff |
                              (uint)(uint3)oVar4.
                                           super__Optional_base<slang::TimeScaleValue,_true,_true>.
                                           _M_payload.
                                           super__Optional_payload_base<slang::TimeScaleValue> <<
                              0x10);
              pTVar6 = (TimeScaleMagnitude *)0x1;
            }
          }
          goto LAB_001b0161;
        }
      }
    }
  }
LAB_001b015f:
  pTVar6 = (TimeScaleMagnitude *)0x0;
LAB_001b0161:
  return (_Optional_base<slang::TimeScale,_true,_true>)
         ((uint5)pTVar7 & 0xffffffff | (uint5)((long)pTVar6 << 0x20));
}

Assistant:

std::optional<TimeScale> TimeScale::fromString(std::string_view str) {
    size_t idx;
    auto base = parseValue(str, idx);
    if (!base)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size() || str[idx] != '/')
        return {};

    do {
        idx++;
    } while (idx < str.size() && str[idx] == ' ');

    if (idx >= str.size())
        return {};

    str = str.substr(idx);
    auto precision = parseValue(str, idx);
    if (!precision || idx != str.length())
        return {};

    // Precision can't be a larger unit of time than the base.
    if (*precision > *base)
        return {};

    return TimeScale(*base, *precision);
}